

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O3

Id __thiscall dxil_spv::Converter::Impl::get_type_id(Impl *this,Type *type,TypeLayoutFlags flags)

{
  pointer *ppAVar1;
  iterator __position;
  TypeID TVar2;
  Id type_id;
  uint uVar3;
  Id IVar4;
  uint uVar5;
  Id id;
  ArrayTypeEntry *cached_type;
  Builder *this_00;
  uint64_t uVar6;
  StructType *this_01;
  VectorType *this_02;
  Type *pTVar7;
  SizeAlignment SVar8;
  pointer pAVar9;
  LoggingCallback p_Var10;
  void *pvVar11;
  int width;
  Vector<spv::Id> member_types;
  Id local_103c;
  vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> local_1038 [171];
  
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  TVar2 = LLVMBC::Type::getTypeID(type);
  IVar4 = 0;
  switch(TVar2) {
  case HalfTyID:
    width = ((byte)~((this->options).min_precision_prefer_native_16bit |
                    (this->execution_mode_meta).native_16bit_operations) & 1) * 0x10 + 0x10;
    break;
  case FloatTyID:
    width = 0x20;
    break;
  case DoubleTyID:
    width = 0x40;
    break;
  case IntegerTyID:
    uVar5 = LLVMBC::Type::getIntegerBitWidth(type);
    if (uVar5 != 1) {
      uVar5 = LLVMBC::Type::getIntegerBitWidth(type);
      uVar5 = physical_integer_bit_width(uVar5);
      IVar4 = spv::Builder::makeIntegerType(this_00,uVar5,false);
      return IVar4;
    }
    IVar4 = spv::Builder::makeBoolType(this_00);
    return IVar4;
  case PointerTyID:
    uVar5 = LLVMBC::Type::getPointerAddressSpace(type);
    if (((flags & 1) != 0) && ((uVar5 & 0xff) == 6)) {
      pTVar7 = LLVMBC::Type::getPointerElementType(type);
      IVar4 = get_type_id(this,pTVar7,flags);
      IVar4 = spv::Builder::makePointer(this_00,StorageClassPhysicalStorageBuffer,IVar4);
      return IVar4;
    }
    p_Var10 = get_thread_log_callback();
    if (p_Var10 != (LoggingCallback)0x0) {
      memcpy(local_1038,
             "Cannot reliably convert LLVM pointer type, we cannot differentiate between Function and Private.\n"
             ,0x62);
      pvVar11 = get_thread_log_callback_userdata();
      (*p_Var10)(pvVar11,Error,(char *)local_1038);
      std::terminate();
    }
    get_type_id();
    std::terminate();
  case ArrayTyID:
    uVar6 = LLVMBC::Type::getArrayNumElements(type);
    if (uVar6 == 0) {
      return 0;
    }
    if ((flags & 1) == 0) {
      pTVar7 = LLVMBC::Type::getArrayElementType(type);
      TVar2 = LLVMBC::Type::getTypeID(pTVar7);
      if (TVar2 == IntegerTyID) {
        pTVar7 = LLVMBC::Type::getArrayElementType(type);
        uVar5 = LLVMBC::Type::getIntegerBitWidth(pTVar7);
        if ((uVar5 == 8) && (uVar6 = LLVMBC::Type::getArrayNumElements(type), (uVar6 & 3) == 0)) {
          uVar6 = LLVMBC::Type::getArrayNumElements(type);
          IVar4 = spv::Builder::makeUintConstant(this_00,(uint)(uVar6 >> 2),false);
          type_id = spv::Builder::makeIntegerType(this_00,0x20,false);
          goto LAB_0011b626;
        }
      }
    }
    uVar6 = LLVMBC::Type::getArrayNumElements(type);
    IVar4 = spv::Builder::makeIntegerType(this_00,0x20,false);
    IVar4 = spv::Builder::makeIntConstant(this_00,IVar4,(uint)uVar6,false);
    pTVar7 = LLVMBC::Type::getArrayElementType(type);
    type_id = get_type_id(this,pTVar7,flags & 0xfffffff7);
    if ((flags & 1) != 0) {
      SVar8 = get_physical_size_for_type(this,type_id);
      pAVar9 = (this->cached_physical_array_types).
               super__Vector_base<dxil_spv::Converter::Impl::ArrayTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ArrayTypeEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      while( true ) {
        if (pAVar9 == (this->cached_physical_array_types).
                      super__Vector_base<dxil_spv::Converter::Impl::ArrayTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ArrayTypeEntry>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          id = spv::Builder::makeArrayType(this_00,type_id,IVar4,SVar8.size);
          spv::Builder::addDecoration(this_00,id,DecorationArrayStride,SVar8.size);
          local_1038[0].
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)CONCAT44(type_id,id);
          local_1038[0].
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)CONCAT44(local_1038[0].
                                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                 ._M_impl.super__Vector_impl_data._M_finish._4_4_,IVar4);
          __position._M_current =
               (this->cached_physical_array_types).
               super__Vector_base<dxil_spv::Converter::Impl::ArrayTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ArrayTypeEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current !=
              (this->cached_physical_array_types).
              super__Vector_base<dxil_spv::Converter::Impl::ArrayTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ArrayTypeEntry>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage) {
            (__position._M_current)->array_size_id = IVar4;
            *(pointer *)__position._M_current =
                 local_1038[0].
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            ppAVar1 = &(this->cached_physical_array_types).
                       super__Vector_base<dxil_spv::Converter::Impl::ArrayTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ArrayTypeEntry>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppAVar1 = *ppAVar1 + 1;
            return id;
          }
          std::
          vector<dxil_spv::Converter::Impl::ArrayTypeEntry,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::ArrayTypeEntry>_>
          ::_M_realloc_insert<dxil_spv::Converter::Impl::ArrayTypeEntry>
                    (&this->cached_physical_array_types,__position,(ArrayTypeEntry *)local_1038);
          return id;
        }
        if ((pAVar9->element_type_id == type_id) && (pAVar9->array_size_id == IVar4)) break;
        pAVar9 = pAVar9 + 1;
      }
      return pAVar9->id;
    }
LAB_0011b626:
    IVar4 = spv::Builder::makeArrayType(this_00,type_id,IVar4,0);
    return IVar4;
  case StructTyID:
    this_01 = LLVMBC::cast<LLVMBC::StructType>(type);
    local_1038[0].super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1038[0].super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = (uint *)0x0;
    local_1038[0].super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
    uVar5 = LLVMBC::Type::getStructNumElements(&this_01->super_Type);
    std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::reserve
              (local_1038,(ulong)uVar5);
    uVar5 = LLVMBC::Type::getStructNumElements(&this_01->super_Type);
    if (uVar5 != 0) {
      uVar5 = 0;
      do {
        pTVar7 = LLVMBC::Type::getStructElementType(&this_01->super_Type,uVar5);
        local_103c = get_type_id(this,pTVar7,flags & 0xfffffff7);
        if (local_1038[0].
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_1038[0].
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::
          _M_realloc_insert<unsigned_int>
                    (local_1038,
                     (iterator)
                     local_1038[0].
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_103c);
        }
        else {
          *local_1038[0].
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish = local_103c;
          local_1038[0].
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_1038[0].
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1;
        }
        uVar5 = uVar5 + 1;
        uVar3 = LLVMBC::Type::getStructNumElements(&this_01->super_Type);
      } while (uVar5 < uVar3);
    }
    IVar4 = get_struct_type(this,local_1038,flags,"");
    if (local_1038[0].
        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      free_in_thread(local_1038[0].
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_start);
    }
  default:
    return IVar4;
  case VectorTyID:
    this_02 = LLVMBC::cast<LLVMBC::VectorType>(type);
    pTVar7 = LLVMBC::VectorType::getElementType(this_02);
    IVar4 = get_type_id(this,pTVar7,0);
    uVar5 = LLVMBC::Type::getVectorNumElements(&this_02->super_Type);
    IVar4 = spv::Builder::makeVectorType(this_00,IVar4,uVar5);
    return IVar4;
  }
  IVar4 = spv::Builder::makeFloatType(this_00,width);
  return IVar4;
}

Assistant:

spv::Id Converter::Impl::get_type_id(const llvm::Type *type, TypeLayoutFlags flags)
{
	auto &builder = spirv_module.get_builder();
	switch (type->getTypeID())
	{
	case llvm::Type::TypeID::HalfTyID:
		return builder.makeFloatType(support_native_fp16_operations() ? 16 : 32);
	case llvm::Type::TypeID::FloatTyID:
		return builder.makeFloatType(32);
	case llvm::Type::TypeID::DoubleTyID:
		return builder.makeFloatType(64);

	case llvm::Type::TypeID::IntegerTyID:
		if (type->getIntegerBitWidth() == 1)
			return builder.makeBoolType();
		else
		{
			auto width = physical_integer_bit_width(type->getIntegerBitWidth());
			return builder.makeIntegerType(width, false);
		}

	case llvm::Type::TypeID::PointerTyID:
	{
		if (DXIL::AddressSpace(type->getPointerAddressSpace()) != DXIL::AddressSpace::PhysicalNodeIO ||
		    (flags & TYPE_LAYOUT_PHYSICAL_BIT) == 0)
		{
			// Have to deal with this from the outside. Should only be relevant for getelementptr and instructions like that.
			LOGE("Cannot reliably convert LLVM pointer type, we cannot differentiate between Function and Private.\n");
			std::terminate();
		}

		// This is free-flowing BDA in DXIL. We'll deal with it as-is.
		// Main complication is that we have to emit Offset information ourselves.
		spv::Id pointee_type = get_type_id(type->getPointerElementType(), flags);
		return builder.makePointer(spv::StorageClassPhysicalStorageBuffer, pointee_type);
	}

	case llvm::Type::TypeID::ArrayTyID:
	{
		if (type->getArrayNumElements() == 0)
			return 0;

		spv::Id array_size_id;
		spv::Id element_type_id;

		// dxbc2dxil emits broken code for TGSM. It's an array of i8 which is absolute nonsense.
		// It then bitcasts the pointer to i32, which isn't legal either.
		if ((flags & TYPE_LAYOUT_PHYSICAL_BIT) == 0 &&
		    type->getArrayElementType()->getTypeID() == llvm::Type::TypeID::IntegerTyID &&
		    type->getArrayElementType()->getIntegerBitWidth() == 8 &&
		    type->getArrayNumElements() % 4 == 0)
		{
			array_size_id = builder.makeUintConstant(type->getArrayNumElements() / 4);
			element_type_id = builder.makeUintType(32);
		}
		else
		{
			array_size_id = builder.makeUintConstant(type->getArrayNumElements());
			element_type_id = get_type_id(type->getArrayElementType(), flags & ~TYPE_LAYOUT_BLOCK_BIT);
		}

		if ((flags & TYPE_LAYOUT_PHYSICAL_BIT) != 0)
		{
			auto size_stride = get_physical_size_for_type(element_type_id);
			uint32_t stride = size_stride.size;

			// We always use scalar layout.
			for (auto &cached_type : cached_physical_array_types)
				if (cached_type.element_type_id == element_type_id && cached_type.array_size_id == array_size_id)
					return cached_type.id;

			spv::Id array_type_id = builder.makeArrayType(element_type_id, array_size_id, stride);
			builder.addDecoration(array_type_id, spv::DecorationArrayStride, stride);
			cached_physical_array_types.push_back({ array_type_id, element_type_id, array_size_id });
			return array_type_id;
		}
		else
		{
			// glslang emitter deduplicates.
			return builder.makeArrayType(element_type_id, array_size_id, 0);
		}
	}

	case llvm::Type::TypeID::StructTyID:
	{
		auto *struct_type = llvm::cast<llvm::StructType>(type);
		Vector<spv::Id> member_types;
		member_types.reserve(struct_type->getStructNumElements());
		for (unsigned i = 0; i < struct_type->getStructNumElements(); i++)
			member_types.push_back(get_type_id(struct_type->getStructElementType(i), flags & ~TYPE_LAYOUT_BLOCK_BIT));
		return get_struct_type(member_types, flags, "");
	}

	case llvm::Type::TypeID::VectorTyID:
	{
		auto *vec_type = llvm::cast<llvm::VectorType>(type);
		return builder.makeVectorType(get_type_id(vec_type->getElementType()), vec_type->getVectorNumElements());
	}

	default:
		return 0;
	}
}